

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O0

AMQP_VALUE amqpvalue_create_sasl_init(SASL_INIT_HANDLE sasl_init)

{
  SASL_INIT_INSTANCE *sasl_init_instance;
  AMQP_VALUE result;
  SASL_INIT_HANDLE sasl_init_local;
  
  if (sasl_init == (SASL_INIT_HANDLE)0x0) {
    sasl_init_instance = (SASL_INIT_INSTANCE *)0x0;
  }
  else {
    sasl_init_instance = (SASL_INIT_INSTANCE *)amqpvalue_clone(sasl_init->composite_value);
  }
  return (AMQP_VALUE)sasl_init_instance;
}

Assistant:

AMQP_VALUE amqpvalue_create_sasl_init(SASL_INIT_HANDLE sasl_init)
{
    AMQP_VALUE result;

    if (sasl_init == NULL)
    {
        result = NULL;
    }
    else
    {
        SASL_INIT_INSTANCE* sasl_init_instance = (SASL_INIT_INSTANCE*)sasl_init;
        result = amqpvalue_clone(sasl_init_instance->composite_value);
    }

    return result;
}